

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

void __thiscall LayoutFile::processWidget(LayoutFile *this,uint8_t *buf,Widget *widget)

{
  bool bVar1;
  int iVar2;
  Button *pBVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  uint8_t *puVar4;
  int iVar5;
  Button *local_78;
  Widget *widget_local;
  vector<Widget*,std::allocator<Widget*>> *local_68;
  LayoutFile *local_60;
  int index;
  string name;
  
  local_68 = (vector<Widget*,std::allocator<Widget*>> *)&this->widgets;
  iVar5 = 0;
  widget_local = widget;
  local_60 = this;
  do {
    if (widget_local->numChildren <= iVar5) {
      return;
    }
    index = 0;
    iVar2 = Util::readInt32(buf,&index);
    puVar4 = buf + iVar2;
    std::__cxx11::string::string
              ((string *)&name,
               (string *)
               &(local_60->types).super__Vector_base<LayoutType,_std::allocator<LayoutType>_>.
                _M_impl.super__Vector_impl_data._M_start[index].name);
    bVar1 = std::operator==(&name,"BusyIndicator");
    if (bVar1) {
      pBVar3 = (Button *)operator_new(0xb0);
      memset(pBVar3,0,0xb0);
      BusyIndicator::BusyIndicator((BusyIndicator *)pBVar3);
      iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
      buf = (uint8_t *)CONCAT44(extraout_var,iVar2);
      if (0 < (pBVar3->super_Widget).numChildren) {
        processWidget(local_60,buf,(Widget *)pBVar3);
      }
      local_78 = pBVar3;
      std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                 (Widget **)&local_78);
      local_78 = pBVar3;
      std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                (local_68,(Widget **)&local_78);
    }
    else {
      bVar1 = std::operator==(&name,"Button");
      if (bVar1) {
        pBVar3 = (Button *)operator_new(0x1c8);
        memset(pBVar3,0,0x1c8);
        Button::Button(pBVar3);
        iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
        buf = (uint8_t *)CONCAT44(extraout_var_00,iVar2);
        if (0 < (pBVar3->super_Widget).numChildren) {
          processWidget(local_60,buf,(Widget *)pBVar3);
        }
        local_78 = pBVar3;
        std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                  ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                   (Widget **)&local_78);
        local_78 = pBVar3;
        std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                  (local_68,(Widget **)&local_78);
      }
      else {
        bVar1 = std::operator==(&name,"Panel");
        if (bVar1) {
          pBVar3 = (Button *)operator_new(0xb8);
          memset(pBVar3,0,0xb8);
          Panel::Panel((Panel *)pBVar3);
          iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
          buf = (uint8_t *)CONCAT44(extraout_var_01,iVar2);
          if (0 < (pBVar3->super_Widget).numChildren) {
            processWidget(local_60,buf,(Widget *)pBVar3);
          }
          local_78 = pBVar3;
          std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                    ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                     (Widget **)&local_78);
          local_78 = pBVar3;
          std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                    (local_68,(Widget **)&local_78);
        }
        else {
          bVar1 = std::operator==(&name,"Label");
          if (bVar1) {
            pBVar3 = (Button *)operator_new(0x138);
            memset(pBVar3,0,0x138);
            Label::Label((Label *)pBVar3);
            iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
            buf = (uint8_t *)CONCAT44(extraout_var_02,iVar2);
            if (0 < (pBVar3->super_Widget).numChildren) {
              processWidget(local_60,buf,(Widget *)pBVar3);
            }
            local_78 = pBVar3;
            std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                      ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                       (Widget **)&local_78);
            local_78 = pBVar3;
            std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                      (local_68,(Widget **)&local_78);
          }
          else {
            bVar1 = std::operator==(&name,"ImageBox");
            if (bVar1) {
              pBVar3 = (Button *)operator_new(0xe0);
              memset(pBVar3,0,0xe0);
              ImageBox::ImageBox((ImageBox *)pBVar3);
              iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
              buf = (uint8_t *)CONCAT44(extraout_var_03,iVar2);
              if (0 < (pBVar3->super_Widget).numChildren) {
                processWidget(local_60,buf,(Widget *)pBVar3);
              }
              local_78 = pBVar3;
              std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                        ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                         (Widget **)&local_78);
              std::vector<Widget_*,_std::allocator<Widget_*>_>::push_back
                        ((vector<Widget_*,_std::allocator<Widget_*>_> *)local_68,&widget_local);
            }
            else {
              bVar1 = std::operator==(&name,"GridListPanel");
              if (bVar1) {
                pBVar3 = (Button *)operator_new(0xd8);
                memset(pBVar3,0,0xd8);
                GridListPanel::GridListPanel((GridListPanel *)pBVar3);
                iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
                buf = (uint8_t *)CONCAT44(extraout_var_04,iVar2);
                if (0 < (pBVar3->super_Widget).numChildren) {
                  processWidget(local_60,buf,(Widget *)pBVar3);
                }
                local_78 = pBVar3;
                std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                          ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                           (Widget **)&local_78);
                local_78 = pBVar3;
                std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                          (local_68,(Widget **)&local_78);
              }
              else {
                bVar1 = std::operator==(&name,"ScrollPanel");
                if (bVar1) {
                  pBVar3 = (Button *)operator_new(0xe8);
                  memset(pBVar3,0,0xe8);
                  ScrollPanel::ScrollPanel((ScrollPanel *)pBVar3);
                  iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
                  buf = (uint8_t *)CONCAT44(extraout_var_05,iVar2);
                  if (0 < (pBVar3->super_Widget).numChildren) {
                    processWidget(local_60,buf,(Widget *)pBVar3);
                  }
                  local_78 = pBVar3;
                  std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                            ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                             (Widget **)&local_78);
                  local_78 = pBVar3;
                  std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                            (local_68,(Widget **)&local_78);
                }
                else {
                  bVar1 = std::operator==(&name,"ListPanel");
                  if (bVar1) {
                    pBVar3 = (Button *)operator_new(0xd8);
                    memset(pBVar3,0,0xd8);
                    ListPanel::ListPanel((ListPanel *)pBVar3);
                    iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
                    buf = (uint8_t *)CONCAT44(extraout_var_06,iVar2);
                    if (0 < (pBVar3->super_Widget).numChildren) {
                      processWidget(local_60,buf,(Widget *)pBVar3);
                    }
                    local_78 = pBVar3;
                    std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                              ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                               (Widget **)&local_78);
                    local_78 = pBVar3;
                    std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                              (local_68,(Widget **)&local_78);
                  }
                  else {
                    bVar1 = std::operator==(&name,"TextField");
                    if (bVar1) {
                      pBVar3 = (Button *)operator_new(0x1a8);
                      memset(pBVar3,0,0x1a8);
                      TextField::TextField((TextField *)pBVar3);
                      iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
                      buf = (uint8_t *)CONCAT44(extraout_var_07,iVar2);
                      if (0 < (pBVar3->super_Widget).numChildren) {
                        processWidget(local_60,buf,(Widget *)pBVar3);
                      }
                      local_78 = pBVar3;
                      std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                                ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                                 (Widget **)&local_78);
                      local_78 = pBVar3;
                      std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                                (local_68,(Widget **)&local_78);
                    }
                    else {
                      bVar1 = std::operator==(&name,"ProgressBar");
                      if (!bVar1) {
                        printf("UNSUPPORTED TYPE! [%s]\n",name._M_dataplus._M_p);
                        exit(1);
                      }
                      pBVar3 = (Button *)operator_new(0xb0);
                      memset(pBVar3,0,0xb0);
                      ProgressBar::ProgressBar((ProgressBar *)pBVar3);
                      iVar2 = (*(pBVar3->super_Widget)._vptr_Widget[1])(pBVar3,puVar4);
                      buf = (uint8_t *)CONCAT44(extraout_var_08,iVar2);
                      local_78 = pBVar3;
                      std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                                ((vector<Widget*,std::allocator<Widget*>> *)&widget_local->children,
                                 (Widget **)&local_78);
                      local_78 = pBVar3;
                      std::vector<Widget*,std::allocator<Widget*>>::emplace_back<Widget*>
                                (local_68,(Widget **)&local_78);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void LayoutFile::processWidget(uint8_t* buf, Widget *widget)
{
	for (int i = 0; i < widget->numChildren; i++)
	{
		int index = 0;
		buf += Util::readInt32(buf, index);

		std::string name = types[index].name;

		if (name == "BusyIndicator")
		{
			BusyIndicator *bi = new BusyIndicator();
			buf = bi->read(buf);
			
			if (bi->numChildren > 0)
				processWidget(buf, bi);

			widget->children.push_back(bi);
			widgets.push_back(bi);
		}
		else if (name == "Button")
		{
			Button *button = new Button();
			buf = button->read(buf);

			if (button->numChildren > 0)
				processWidget(buf, button);

			widget->children.push_back(button);
			widgets.push_back(button);
		}
		else if (name == "Panel")
		{
			Panel *panel = new Panel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "Label")
		{
			Label *label = new Label();
			buf = label->read(buf);

			if (label->numChildren > 0)
				processWidget(buf, label);

			widget->children.push_back(label);
			widgets.push_back(label);
		}
		else if (name == "ImageBox")
		{
			ImageBox *imageBox = new ImageBox();
			buf = imageBox->read(buf);

			if (imageBox->numChildren > 0)
			{
				processWidget(buf, imageBox);
			}

			widget->children.push_back(imageBox);
			widgets.push_back(widget);
		}
		else if (name == "GridListPanel")
		{
			GridListPanel *panel = new GridListPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "ScrollPanel")
		{
			ScrollPanel *panel = new ScrollPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "ListPanel")
		{
			ListPanel *panel = new ListPanel();
			buf = panel->read(buf);

			if (panel->numChildren > 0)
				processWidget(buf, panel);

			widget->children.push_back(panel);
			widgets.push_back(panel);
		}
		else if (name == "TextField")
		{
			TextField *textField = new TextField();
			buf = textField->read(buf);

			if (textField->numChildren > 0)
				processWidget(buf, textField);

			widget->children.push_back(textField);
			widgets.push_back(textField);
		}
		else if (name == "ProgressBar")
		{
			ProgressBar *progressBar = new ProgressBar();
			buf = progressBar->read(buf);

			widget->children.push_back(progressBar);
			widgets.push_back(progressBar);
		}
		else
		{
			printf("UNSUPPORTED TYPE! [%s]\n", name.c_str());
			exit(1);
		}
	}
}